

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void __thiscall
sensors_analytics::utils::ObjectNode::SetList
          (ObjectNode *this,string *property_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  mapped_type *this_00;
  ValueNode VStack_98;
  
  ValueNode::ValueNode(&VStack_98,value);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
            ::operator[](&this->properties_map_,property_name);
  ValueNode::operator=(this_00,&VStack_98);
  ValueNode::~ValueNode(&VStack_98);
  return;
}

Assistant:

void ObjectNode::SetList(const string &property_name,
                         const std::vector<string> &value) {
  properties_map_[property_name] = ValueNode(value);
}